

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_mobj.cpp
# Opt level: O2

int AF_AActor_AngleTo(VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,
                     VMReturn *ret,int numret)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  DObject *this;
  AActor *other;
  _func_int **local_38;
  
  if (numparam < 1) {
    pcVar3 = "(paramnum) < numparam";
    goto LAB_004370b2;
  }
  if ((param->field_0).field_3.Type != '\x03') {
LAB_00437099:
    pcVar3 = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
LAB_004370b2:
    __assert_fail(pcVar3,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                  ,0x1e1a,
                  "int AF_AActor_AngleTo(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
  other = (AActor *)(param->field_0).field_1.a;
  if ((param->field_0).field_1.atag == 1) {
    if (other == (AActor *)0x0) goto LAB_00436fbb;
    bVar1 = DObject::IsKindOf((DObject *)other,AActor::RegistrationInfo.MyClass);
    if (!bVar1) {
      pcVar3 = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
      goto LAB_004370b2;
    }
  }
  else {
    if (other != (AActor *)0x0) goto LAB_00437099;
LAB_00436fbb:
    other = (AActor *)0x0;
  }
  if (numparam == 1) {
    pcVar3 = "(paramnum) < numparam";
    goto LAB_004370d1;
  }
  if (param[1].field_0.field_3.Type != '\x03') {
LAB_004370a2:
    pcVar3 = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
    goto LAB_004370d1;
  }
  this = *(DObject **)&param[1].field_0;
  if (param[1].field_0.field_1.atag == 1) {
    if (this == (DObject *)0x0) goto LAB_00436ff1;
LAB_00437006:
    bVar1 = DObject::IsKindOf(this,AActor::RegistrationInfo.MyClass);
    if (!bVar1) {
      pcVar3 = "targ == NULL || targ->IsKindOf(RUNTIME_CLASS(AActor))";
LAB_004370d1:
      __assert_fail(pcVar3,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                    ,0x1e1b,
                    "int AF_AActor_AngleTo(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
    }
  }
  else {
    if (this != (DObject *)0x0) goto LAB_004370a2;
LAB_00436ff1:
    NullParam("\"targ\"");
    this = *(DObject **)&param[1].field_0;
    if (this != (DObject *)0x0) goto LAB_00437006;
    this = (DObject *)0x0;
  }
  if ((uint)numparam < 3) {
    if (defaultparam->Array[2].field_0.field_3.Type == '\0') goto LAB_00437050;
    pcVar3 = "(defaultparam[paramnum]).Type == REGT_INT";
  }
  else {
    if (param[2].field_0.field_3.Type == '\0') {
LAB_00437050:
      AActor::AngleTo((AActor *)&stack0xffffffffffffffc8,other,SUB81(this,0));
      if (numret < 1) {
        iVar2 = 0;
      }
      else {
        if (ret == (VMReturn *)0x0) {
          __assert_fail("ret != nullptr",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                        ,0x1e1d,
                        "int AF_AActor_AngleTo(VMValue *, TArray<VMValue> &, int, VMReturn *, int)")
          ;
        }
        VMReturn::SetFloat(ret,(double)local_38);
        iVar2 = 1;
      }
      return iVar2;
    }
    pcVar3 = "(param[paramnum]).Type == REGT_INT";
  }
  __assert_fail(pcVar3,
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                ,0x1e1c,"int AF_AActor_AngleTo(VMValue *, TArray<VMValue> &, int, VMReturn *, int)")
  ;
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, AngleTo)
{
	PARAM_SELF_PROLOGUE(AActor);
	PARAM_OBJECT_NOT_NULL(targ, AActor);
	PARAM_BOOL_DEF(absolute);
	ACTION_RETURN_FLOAT(self->AngleTo(targ, absolute).Degrees);
}